

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# PlyExporter.cpp
# Opt level: O0

void __thiscall Assimp::PlyExporter::WriteMeshVerts(PlyExporter *this,aiMesh *m,uint components)

{
  bool bVar1;
  ostream *poVar2;
  double dVar3;
  uint local_30;
  uint local_2c;
  uint c_1;
  uint n_1;
  uint c;
  uint n;
  uint i;
  uint components_local;
  aiMesh *m_local;
  PlyExporter *this_local;
  
  c = 0;
  do {
    if (m->mNumVertices <= c) {
      return;
    }
    poVar2 = (ostream *)std::ostream::operator<<(this,m->mVertices[c].x);
    poVar2 = std::operator<<(poVar2," ");
    poVar2 = (ostream *)std::ostream::operator<<(poVar2,m->mVertices[c].y);
    poVar2 = std::operator<<(poVar2," ");
    std::ostream::operator<<(poVar2,m->mVertices[c].z);
    if ((components & 1) != 0) {
      bVar1 = aiMesh::HasNormals(m);
      if ((bVar1) && (bVar1 = is_not_qnan<float>(m->mNormals[c].x), bVar1)) {
        dVar3 = std::fabs((double)(ulong)(uint)m->mNormals[c].x);
        if ((SUB84(dVar3,0) != INFINITY) || (NAN(SUB84(dVar3,0)))) {
          poVar2 = std::operator<<((ostream *)this," ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,m->mNormals[c].x);
          poVar2 = std::operator<<(poVar2," ");
          poVar2 = (ostream *)std::ostream::operator<<(poVar2,m->mNormals[c].y);
          poVar2 = std::operator<<(poVar2," ");
          std::ostream::operator<<(poVar2,m->mNormals[c].z);
          goto LAB_00afd3cf;
        }
      }
      std::operator<<((ostream *)this," 0.0 0.0 0.0");
    }
LAB_00afd3cf:
    c_1 = 0;
    for (n_1 = 4; (components & n_1) != 0 && c_1 != 8; n_1 = n_1 << 1) {
      bVar1 = aiMesh::HasTextureCoords(m,c_1);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)this," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,m->mTextureCoords[c_1][c].x);
        poVar2 = std::operator<<(poVar2," ");
        std::ostream::operator<<(poVar2,m->mTextureCoords[c_1][c].y);
      }
      else {
        std::operator<<((ostream *)this," -1.0 -1.0");
      }
      c_1 = c_1 + 1;
    }
    local_30 = 0;
    for (local_2c = 0x400; (components & local_2c) != 0 && local_30 != 8; local_2c = local_2c << 1)
    {
      bVar1 = aiMesh::HasVertexColors(m,local_30);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)this," ");
        poVar2 = (ostream *)
                 std::ostream::operator<<(poVar2,(int)(m->mColors[local_30][c].r * 255.0));
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)
                 std::ostream::operator<<(poVar2,(int)(m->mColors[local_30][c].g * 255.0));
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)
                 std::ostream::operator<<(poVar2,(int)(m->mColors[local_30][c].b * 255.0));
        poVar2 = std::operator<<(poVar2," ");
        std::ostream::operator<<(poVar2,(int)(m->mColors[local_30][c].a * 255.0));
      }
      else {
        std::operator<<((ostream *)this," 0 0 0");
      }
      local_30 = local_30 + 1;
    }
    if ((components & 2) != 0) {
      bVar1 = aiMesh::HasTangentsAndBitangents(m);
      if (bVar1) {
        poVar2 = std::operator<<((ostream *)this," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,m->mTangents[c].x);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,m->mTangents[c].y);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,m->mTangents[c].z);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,m->mBitangents[c].x);
        poVar2 = std::operator<<(poVar2," ");
        poVar2 = (ostream *)std::ostream::operator<<(poVar2,m->mBitangents[c].y);
        poVar2 = std::operator<<(poVar2," ");
        std::ostream::operator<<(poVar2,m->mBitangents[c].z);
      }
      else {
        std::operator<<((ostream *)this," 0.0 0.0 0.0 0.0 0.0 0.0");
      }
    }
    std::operator<<((ostream *)this,(string *)&this->endl);
    c = c + 1;
  } while( true );
}

Assistant:

void PlyExporter::WriteMeshVerts(const aiMesh* m, unsigned int components)
{
    static const ai_real inf = std::numeric_limits<ai_real>::infinity();

    // If a component (for instance normal vectors) is present in at least one mesh in the scene,
    // then default values are written for meshes that do not contain this component.
    for (unsigned int i = 0; i < m->mNumVertices; ++i) {
        mOutput <<
            m->mVertices[i].x << " " <<
            m->mVertices[i].y << " " <<
            m->mVertices[i].z
        ;
        if(components & PLY_EXPORT_HAS_NORMALS) {
            if (m->HasNormals() && is_not_qnan(m->mNormals[i].x) && std::fabs(m->mNormals[i].x) != inf) {
                mOutput <<
                    " " << m->mNormals[i].x <<
                    " " << m->mNormals[i].y <<
                    " " << m->mNormals[i].z;
            }
            else {
                mOutput << " 0.0 0.0 0.0";
            }
        }

        for (unsigned int n = PLY_EXPORT_HAS_TEXCOORDS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_TEXTURECOORDS; n <<= 1, ++c) {
            if (m->HasTextureCoords(c)) {
                mOutput <<
                    " " << m->mTextureCoords[c][i].x <<
                    " " << m->mTextureCoords[c][i].y;
            }
            else {
                mOutput << " -1.0 -1.0";
            }
        }

        for (unsigned int n = PLY_EXPORT_HAS_COLORS, c = 0; (components & n) && c != AI_MAX_NUMBER_OF_COLOR_SETS; n <<= 1, ++c) {
            if (m->HasVertexColors(c)) {
                mOutput <<
                    " " << (int)(m->mColors[c][i].r * 255) <<
                    " " << (int)(m->mColors[c][i].g * 255) <<
                    " " << (int)(m->mColors[c][i].b * 255) <<
                    " " << (int)(m->mColors[c][i].a * 255);
            }
            else {
                mOutput << " 0 0 0";
            }
        }

        if(components & PLY_EXPORT_HAS_TANGENTS_BITANGENTS) {
            if (m->HasTangentsAndBitangents()) {
                mOutput <<
                " " << m->mTangents[i].x <<
                " " << m->mTangents[i].y <<
                " " << m->mTangents[i].z <<
                " " << m->mBitangents[i].x <<
                " " << m->mBitangents[i].y <<
                " " << m->mBitangents[i].z
                ;
            }
            else {
                mOutput << " 0.0 0.0 0.0 0.0 0.0 0.0";
            }
        }

        mOutput << endl;
    }
}